

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O2

void __thiscall CNNTest_TestMultithreading_Test::TestBody(CNNTest_TestMultithreading_Test *this)

{
  AVxWorkerInterface *pAVar1;
  long lVar2;
  CNN_THREAD_DATA local_20a8;
  float input [4];
  float bias [4];
  float expected [16];
  AVxWorker workers [4];
  float weights [36];
  CNN_CONFIG local_1ec0;
  
  input[0] = -2.0;
  input[1] = 4.0;
  input[2] = 1.0;
  input[3] = 0.0;
  memcpy(weights,&DAT_00a998c0,0x90);
  bias[0] = -4.0;
  bias[1] = -3.0;
  bias[2] = -2.0;
  bias[3] = 3.0;
  expected[0xc] = 4.0;
  expected[0xd] = 13.0;
  expected[0xe] = 9.0;
  expected[0xf] = -14.0;
  expected[8] = -5.0;
  expected[9] = -5.0;
  expected[10] = 7.0;
  expected[0xb] = -10.0;
  expected[4] = -24.0;
  expected[5] = 5.0;
  expected[6] = -15.0;
  expected[7] = 6.0;
  expected[0] = 2.0;
  expected[1] = 10.0;
  expected[2] = -8.0;
  expected[3] = -17.0;
  memset(&local_1ec0,0,0x1e90);
  local_1ec0.num_layers = 1;
  local_1ec0.layer_config[0].in_channels = 1;
  local_1ec0.layer_config[0].filter_width = 3;
  local_1ec0.layer_config[0].filter_height = 3;
  local_1ec0.layer_config[0].out_channels = 4;
  local_1ec0.layer_config[0].skip_width = 1;
  local_1ec0.layer_config[0].skip_height = 1;
  local_1ec0.layer_config[0].activation = '\0';
  local_1ec0.layer_config[0].branch_combine_type = '\0';
  local_20a8.num_workers = 1;
  local_20a8._4_4_ = 0;
  local_20a8.workers = (AVxWorker *)0x0;
  local_1ec0.layer_config[0].weights = weights;
  local_1ec0.layer_config[0].bias = bias;
  anon_unknown.dwarf_4e9173::CNNTest::RunCNNTest(2,2,input,expected,&local_1ec0,2,&local_20a8,1e-06)
  ;
  pAVar1 = aom_get_worker_interface();
  for (lVar2 = 0; lVar2 != 0xe0; lVar2 = lVar2 + 0x38) {
    (*pAVar1->init)((AVxWorker *)((long)&workers[0].impl_ + lVar2));
  }
  local_20a8.num_workers = 4;
  local_20a8.workers = workers;
  anon_unknown.dwarf_4e9173::CNNTest::RunCNNTest(2,2,input,expected,&local_1ec0,2,&local_20a8,1e-06)
  ;
  for (lVar2 = 0; lVar2 != 0xe0; lVar2 = lVar2 + 0x38) {
    (*pAVar1->end)((AVxWorker *)((long)&workers[0].impl_ + lVar2));
  }
  return;
}

Assistant:

TEST_F(CNNTest, TestMultithreading) {
  int image_height = 2;
  int image_width = 2;
  int filter_height = 3;
  int filter_width = 3;

  float input[] = {
    -2,
    4,
    1,
    0,
  };

  float weights[] = {
    -4, 2, -2, 0,  -4, 4, -3, -3, -3, -1, 1,  0,  -5, -3, 0, -5, 0, 0,
    -1, 0, 2,  -5, 0,  1, 4,  2,  1,  0,  -2, -1, -5, -3, 2, -2, 1, -5,
  };

  float bias[] = {
    -4,
    -3,
    -2,
    3,
  };

  float expected[] = {
    2, 10, -8, -17, -24, 5, -15, 6, -5, -5, 7, -10, 4, 13, 9, -14,
  };

  CNN_CONFIG cnn_config = {
    1,
    0,
    0,
    0,
    0,
    {
        {
            1,
            filter_width,
            filter_height,
            4,
            1,
            1,
            0,
            weights,
            bias,
            PADDING_SAME_ZERO,
            NONE,
            0,
            0,
            BRANCH_NO_COPY,
            BRANCH_NOC,
            {},
            {},
            0,
        },
    },
  };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  AVxWorker workers[4];

  for (int i = 0; i < 4; ++i) {
    winterface->init(&workers[i]);
  }

  thread_data = { 4, workers };

  RunCNNTest(image_width, image_height, input, expected, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  for (int i = 0; i < 4; ++i) {
    winterface->end(&workers[i]);
  }
}